

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError cbor_encode_floating_point(CborEncoder *encoder,CborType fpType,void *value)

{
  long lVar1;
  int iVar2;
  CborError CVar3;
  void *in_RDX;
  undefined4 in_ESI;
  CborEncoder *in_RDI;
  long in_FS_OFFSET;
  uint size;
  uint8_t buf [9];
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 uVar4;
  uint16_t v;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 2 << ((char)in_ESI + 7U & 0x1f);
  uVar4 = (undefined2)iVar2;
  v = (uint16_t)((uint)iVar2 >> 0x10);
  if (iVar2 == 8) {
    put64(in_RDX,CONCAT26(v,CONCAT24(uVar4,in_stack_ffffffffffffffc8)));
  }
  else if (iVar2 == 4) {
    put32(in_RDX,4);
  }
  else {
    put16(in_RDX,v);
  }
  saturated_decrement(in_RDI);
  CVar3 = append_to_buffer((CborEncoder *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),in_RDX,
                           CONCAT26(v,CONCAT24(uVar4,in_stack_ffffffffffffffc8)),
                           CborEncoderAppendCborData);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return CVar3;
}

Assistant:

CborError cbor_encode_floating_point(CborEncoder *encoder, CborType fpType, const void *value)
{
    unsigned size;
    uint8_t buf[1 + sizeof(uint64_t)];
    cbor_assert(fpType == CborHalfFloatType || fpType == CborFloatType || fpType == CborDoubleType);
    buf[0] = fpType;

    size = 2U << (fpType - CborHalfFloatType);
    if (size == 8)
        put64(buf + 1, *(const uint64_t*)value);
    else if (size == 4)
        put32(buf + 1, *(const uint32_t*)value);
    else
        put16(buf + 1, *(const uint16_t*)value);
    saturated_decrement(encoder);
    return append_to_buffer(encoder, buf, size + 1, CborEncoderAppendCborData);
}